

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_base_loop(event_base *base,int flags)

{
  undefined2 uVar1;
  event_callback *peVar2;
  event_callback **ppeVar3;
  event_callback *peVar4;
  event *peVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  unsigned_long uVar9;
  uint uVar10;
  timeval *endtime;
  void *pvVar11;
  char *fmt;
  long lVar12;
  long lVar13;
  eventop *peVar14;
  timeval *ptVar15;
  bool bVar16;
  bool bVar17;
  timeval now;
  timeval local_78;
  timeval local_68;
  uint local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  eventop *local_40;
  timeval *local_38;
  
  peVar14 = base->evsel;
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (base->running_loop == 0) {
    base->running_loop = 1;
    (base->tv_cache).tv_sec = 0;
    if (((base->sig).ev_signal_added != 0) && ((base->sig).ev_n_signals_added != 0)) {
      evsig_set_base_(base);
    }
    if (evthread_id_fn_ == (_func_unsigned_long *)0x0) {
      uVar9 = 1;
    }
    else {
      uVar9 = (*evthread_id_fn_)();
    }
    local_38 = &base->tv_cache;
    base->th_owner_id = uVar9;
    base->event_gotterm = 0;
    base->event_break = 0;
    local_48 = flags & 2;
    local_4c = local_48 >> 1;
    local_50 = flags;
    local_40 = peVar14;
    do {
      base->event_continue = 0;
      base->n_deferreds_queued = 0;
      if ((base->event_gotterm != 0) || (base->event_break != 0)) break;
      if (base->event_count_active == 0 && local_48 == 0) {
        if (((base->timeheap).n == 0) || (peVar5 = *(base->timeheap).p, peVar5 == (event *)0x0)) {
          ptVar15 = (timeval *)0x0;
          goto LAB_00249b8e;
        }
        iVar7 = gettime(base,&local_78);
        ptVar15 = &local_68;
        if (iVar7 == -1) goto LAB_00249b8e;
        lVar12 = (peVar5->ev_timeout).tv_sec;
        lVar13 = lVar12 - local_78.tv_sec;
        if (lVar13 != 0) {
          if (lVar13 == 0 || lVar12 < local_78.tv_sec) goto LAB_00249ed8;
          lVar12 = (peVar5->ev_timeout).tv_usec;
        }
        else {
          lVar12 = (peVar5->ev_timeout).tv_usec;
          if (lVar12 <= local_78.tv_usec) {
LAB_00249ed8:
            local_68.tv_sec = 0;
            local_68.tv_usec = 0;
            goto LAB_00249b8e;
          }
        }
        lVar12 = lVar12 - local_78.tv_usec;
        local_68.tv_usec = lVar12;
        local_68.tv_sec = lVar13;
        if (lVar12 < 0) {
          lVar13 = lVar13 + -1;
          lVar12 = lVar12 + 1000000;
          local_68.tv_usec = lVar12;
          local_68.tv_sec = lVar13;
        }
        if (-1 < lVar13) {
          if (lVar12 < 0) goto LAB_00249f86;
          if (event_debug_logging_mask_ != 0) {
            event_debugx_("timeout_next: event: %p, in %d seconds, %d useconds",peVar5);
            goto LAB_00249b32;
          }
          goto LAB_00249b8e;
        }
LAB_00249f81:
        event_base_loop_cold_2();
LAB_00249f86:
        event_base_loop_cold_1();
      }
      local_68.tv_sec = 0;
      local_68.tv_usec = 0;
LAB_00249b32:
      ptVar15 = &local_68;
LAB_00249b8e:
      if (((((flags & 4U) == 0) && (base->virtual_event_count < 1)) && (base->event_count < 1)) &&
         (base->event_count_active == 0)) {
LAB_00249f62:
        iVar7 = 1;
        if (event_debug_logging_mask_ == 0) goto LAB_00249f1f;
        fmt = "%s: no events registered.";
        goto LAB_00249f11;
      }
      if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
         (iVar7 = evthread_is_debug_lock_held_(base->th_base_lock), iVar7 == 0)) {
        event_base_loop_cold_4();
        goto LAB_00249f81;
      }
      while (peVar4 = (base->active_later_queue).tqh_first, peVar4 != (event_callback *)0x0) {
        peVar2 = (peVar4->evcb_active_next).tqe_next;
        ppeVar3 = (peVar4->evcb_active_next).tqe_prev;
        if (peVar2 == (event_callback *)0x0) {
          peVar2 = (event_callback *)&base->active_later_queue;
        }
        (peVar2->evcb_active_next).tqe_prev = ppeVar3;
        *ppeVar3 = (peVar4->evcb_active_next).tqe_next;
        uVar1 = peVar4->evcb_flags;
        peVar4->evcb_flags = uVar1 & 0xffd7 | 8;
        bVar6 = peVar4->evcb_pri;
        if (base->nactivequeues <= (int)(uint)bVar6) {
          event_base_loop_cold_3();
          goto LAB_00249f62;
        }
        (peVar4->evcb_active_next).tqe_next = (event_callback *)0x0;
        (peVar4->evcb_active_next).tqe_prev = base->activequeues[bVar6].tqh_last;
        *base->activequeues[bVar6].tqh_last = peVar4;
        base->activequeues[peVar4->evcb_pri].tqh_last = (event_callback **)peVar4;
        base->n_deferreds_queued = base->n_deferreds_queued + (uint)(peVar4->evcb_closure == '\x03')
        ;
      }
      (base->tv_cache).tv_sec = 0;
      iVar7 = (*peVar14->dispatch)(base,ptVar15);
      if (iVar7 == -1) {
        iVar7 = -1;
        if (event_debug_logging_mask_ == 0) goto LAB_00249f1f;
        fmt = "%s: dispatch returned unsuccessfully.";
        goto LAB_00249f11;
      }
      (base->tv_cache).tv_sec = 0;
      if ((base->flags & EVENT_BASE_FLAG_NO_CACHE_TIME) == 0) {
        gettime(base,local_38);
      }
      if ((base->timeheap).n != 0) {
        gettime(base,&local_78);
        while (((base->timeheap).n != 0 && (peVar5 = *(base->timeheap).p, peVar5 != (event *)0x0)))
        {
          lVar12 = (peVar5->ev_timeout).tv_sec;
          bVar17 = SBORROW8(lVar12,local_78.tv_sec);
          lVar13 = lVar12 - local_78.tv_sec;
          bVar16 = lVar12 == local_78.tv_sec;
          if (bVar16) {
            lVar12 = (peVar5->ev_timeout).tv_usec;
            bVar17 = SBORROW8(lVar12,local_78.tv_usec);
            lVar13 = lVar12 - local_78.tv_usec;
            bVar16 = lVar12 == local_78.tv_usec;
          }
          if (!bVar16 && bVar17 == lVar13 < 0) break;
          event_del_nolock_(peVar5,0);
          if (event_debug_logging_mask_ != 0) {
            event_debugx_("timeout_process: event: %p, call %p",peVar5,
                          (peVar5->ev_evcallback).evcb_cb_union.evcb_callback);
          }
          event_active_nolock_(peVar5,1,1);
        }
      }
      uVar10 = local_4c;
      if (base->event_count_active != 0) {
        local_44 = base->max_dispatch_callbacks;
        iVar7 = base->limit_callbacks_after_prio;
        if ((base->max_dispatch_time).tv_sec < 0) {
          ptVar15 = (timeval *)0x0;
        }
        else {
          (base->tv_cache).tv_sec = 0;
          if ((base->flags & EVENT_BASE_FLAG_NO_CACHE_TIME) == 0) {
            gettime(base,local_38);
          }
          gettime(base,&local_78);
          local_78.tv_sec = (base->max_dispatch_time).tv_sec + local_78.tv_sec;
          local_78.tv_usec = (base->max_dispatch_time).tv_usec + local_78.tv_usec;
          ptVar15 = &local_78;
          if (999999 < local_78.tv_usec) {
            local_78.tv_sec = local_78.tv_sec + 1;
            local_78.tv_usec = local_78.tv_usec + -1000000;
            ptVar15 = &local_78;
          }
        }
        iVar8 = base->nactivequeues;
        if (iVar8 < 1) {
          bVar6 = 0;
        }
        else {
          lVar12 = 0;
          lVar13 = 0;
          do {
            if (*(long *)((long)&base->activequeues->tqh_first + lVar12) != 0) {
              base->event_running_priority = (int)lVar13;
              endtime = ptVar15;
              iVar8 = local_44;
              if (lVar13 < iVar7) {
                endtime = (timeval *)0x0;
                iVar8 = 0x7fffffff;
              }
              iVar8 = event_process_active_single_queue
                                (base,(evcallback_list *)
                                      ((long)&base->activequeues->tqh_first + lVar12),iVar8,endtime)
              ;
              if (iVar8 != 0) {
                bVar6 = 1;
                peVar14 = local_40;
                goto LAB_00249e45;
              }
              iVar8 = base->nactivequeues;
            }
            lVar13 = lVar13 + 1;
            lVar12 = lVar12 + 0x10;
          } while (lVar13 < iVar8);
          bVar6 = 0;
          peVar14 = local_40;
        }
LAB_00249e45:
        uVar10 = 0;
        base->event_running_priority = -1;
        flags = local_50;
        if ((local_50 & 1) != 0) {
          uVar10 = (uint)(bVar6 & base->event_count_active == 0);
        }
      }
    } while (uVar10 == 0);
    iVar7 = 0;
    if (event_debug_logging_mask_ != 0) {
      fmt = "%s: asked to terminate loop.";
LAB_00249f11:
      event_debugx_(fmt,"event_base_loop");
    }
LAB_00249f1f:
    (base->tv_cache).tv_sec = 0;
    base->running_loop = 0;
    pvVar11 = base->th_base_lock;
  }
  else {
    event_warnx("%s: reentrant invocation.  Only one event_base_loop can run on each event_base at once."
                ,"event_base_loop");
    pvVar11 = base->th_base_lock;
    iVar7 = -1;
  }
  if (pvVar11 != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,pvVar11);
  }
  return iVar7;
}

Assistant:

int
event_base_loop(struct event_base *base, int flags)
{
	const struct eventop *evsel = base->evsel;
	struct timeval tv;
	struct timeval *tv_p;
	int res, done, retval = 0;

	/* Grab the lock.  We will release it inside evsel.dispatch, and again
	 * as we invoke user callbacks. */
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (base->running_loop) {
		event_warnx("%s: reentrant invocation.  Only one event_base_loop"
		    " can run on each event_base at once.", __func__);
		EVBASE_RELEASE_LOCK(base, th_base_lock);
		return -1;
	}

	base->running_loop = 1;

	clear_time_cache(base);

	if (base->sig.ev_signal_added && base->sig.ev_n_signals_added)
		evsig_set_base_(base);

	done = 0;

#ifndef EVENT__DISABLE_THREAD_SUPPORT
	base->th_owner_id = EVTHREAD_GET_ID();
#endif

	base->event_gotterm = base->event_break = 0;

	while (!done) {
		base->event_continue = 0;
		base->n_deferreds_queued = 0;

		/* Terminate the loop if we have been asked to */
		if (base->event_gotterm) {
			break;
		}

		if (base->event_break) {
			break;
		}

		tv_p = &tv;
		if (!N_ACTIVE_CALLBACKS(base) && !(flags & EVLOOP_NONBLOCK)) {
			timeout_next(base, &tv_p);
		} else {
			/*
			 * if we have active events, we just poll new events
			 * without waiting.
			 */
			evutil_timerclear(&tv);
		}

		/* If we have no events, we just exit */
		if (0==(flags&EVLOOP_NO_EXIT_ON_EMPTY) &&
		    !event_haveevents(base) && !N_ACTIVE_CALLBACKS(base)) {
			event_debug(("%s: no events registered.", __func__));
			retval = 1;
			goto done;
		}

		event_queue_make_later_events_active(base);

		clear_time_cache(base);

		res = evsel->dispatch(base, tv_p);

		if (res == -1) {
			event_debug(("%s: dispatch returned unsuccessfully.",
				__func__));
			retval = -1;
			goto done;
		}

		update_time_cache(base);

		timeout_process(base);

		if (N_ACTIVE_CALLBACKS(base)) {
			int n = event_process_active(base);
			if ((flags & EVLOOP_ONCE)
			    && N_ACTIVE_CALLBACKS(base) == 0
			    && n != 0)
				done = 1;
		} else if (flags & EVLOOP_NONBLOCK)
			done = 1;
	}
	event_debug(("%s: asked to terminate loop.", __func__));

done:
	clear_time_cache(base);
	base->running_loop = 0;

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	return (retval);
}